

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ResumeIdleDecommit
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  DWORD DVar4;
  undefined4 *puVar5;
  ThreadContextId pvVar6;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_local;
  
  if (this->idleDecommitEnterCount == 0) {
    uVar3 = (*this->_vptr_PageAllocatorBase[2])();
    if ((uVar3 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x77e,"(this->IsIdleDecommitPageAllocator())",
                         "this->IsIdleDecommitPageAllocator()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if ((bVar2) && ((this->pageAllocatorFlagTable->Verbose & 1U) != 0)) {
      pvVar6 = GetCurrentThreadContextId();
      DVar4 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar6,(ulong)DVar4,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ",this->debugName);
      }
      Output::Print(L"ResumeIdleDecommit");
      Output::Print(L"\n");
      Output::Flush();
    }
    CCLock::Leave((CCLock *)&this[1].disableThreadAccessCheck);
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::ResumeIdleDecommit()
{
#ifdef IDLE_DECOMMIT_ENABLED
    if (this->idleDecommitEnterCount != 0)
    {
        return;
    }
    Assert(this->IsIdleDecommitPageAllocator());
    PAGE_ALLOC_VERBOSE_TRACE(_u("ResumeIdleDecommit"));
    ((IdleDecommitPageAllocator *)this)->cs.Leave();
#endif
}